

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

SPIREntryPoint * __thiscall
spirv_cross::Compiler::get_first_entry_point(Compiler *this,string *name)

{
  bool bVar1;
  CompilerError *this_00;
  pointer ppVar2;
  allocator local_61;
  string local_60 [32];
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
  local_20;
  _Node_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_false,_true>
  itr;
  string *name_local;
  Compiler *this_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
             )(_Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
               )name;
  local_28._M_cur =
       (__node_type *)
       ::std::
       begin<std::unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,spirv_cross::SPIREntryPoint,std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>>>>
                 (&(this->ir).entry_points);
  local_30._M_cur =
       (__node_type *)
       ::std::
       end<std::unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,spirv_cross::SPIREntryPoint,std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>>>>
                 (&(this->ir).entry_points);
  local_38 = itr.
             super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
             ._M_cur;
  local_20._M_cur =
       (__node_type *)
       ::std::
       find_if<std::__detail::_Node_iterator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>,false,true>,spirv_cross::Compiler::get_first_entry_point(std::__cxx11::string_const&)::__0>
                 (local_28._M_cur,
                  (_Node_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_false,_true>
                   )local_30._M_cur,
                  itr.
                  super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
                  ._M_cur);
  local_40._M_cur =
       (__node_type *)
       ::std::
       end<std::unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,spirv_cross::SPIREntryPoint,std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>>>>
                 (&(this->ir).entry_points);
  bVar1 = ::std::__detail::operator==(&local_20,&local_40);
  if (!bVar1) {
    ppVar2 = ::std::__detail::
             _Node_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_false,_true>
                           *)&local_20);
    return &ppVar2->second;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_60,"Entry point does not exist.",&local_61);
  CompilerError::CompilerError(this_00,(string *)local_60);
  __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

SPIREntryPoint &Compiler::get_first_entry_point(const std::string &name)
{
	auto itr = find_if(
	    begin(ir.entry_points), end(ir.entry_points),
	    [&](const std::pair<uint32_t, SPIREntryPoint> &entry) -> bool { return entry.second.orig_name == name; });

	if (itr == end(ir.entry_points))
		SPIRV_CROSS_THROW("Entry point does not exist.");

	return itr->second;
}